

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_object.cpp
# Opt level: O0

object_ptr __thiscall mjs::new_string(mjs *this,gc_heap_ptr<mjs::global_object> *global,string *val)

{
  undefined8 args_3;
  global_object *pgVar1;
  gc_heap *args;
  undefined8 extraout_RDX;
  object_ptr oVar2;
  object local_60;
  undefined1 local_40 [24];
  object_ptr proto;
  string *val_local;
  gc_heap_ptr<mjs::global_object> *global_local;
  
  proto.super_gc_heap_ptr_untyped._8_8_ = val;
  pgVar1 = gc_heap_ptr<mjs::global_object>::operator->(global);
  (*(pgVar1->super_object)._vptr_object[0xd])(local_40 + 0x10);
  pgVar1 = gc_heap_ptr<mjs::global_object>::operator->(global);
  args = object::heap(&pgVar1->super_object);
  gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)(local_40 + 0x10));
  object::class_name(&local_60);
  args_3 = proto.super_gc_heap_ptr_untyped._8_8_;
  pgVar1 = gc_heap_ptr<mjs::global_object>::operator->(global);
  global_object::language_version(pgVar1);
  gc_heap::
  make<mjs::string_object,mjs::string,mjs::gc_heap_ptr<mjs::object>&,mjs::string_const&,bool>
            ((gc_heap *)local_40,(string *)args,(gc_heap_ptr<mjs::object> *)&local_60,
             (string *)(local_40 + 0x10),(bool *)args_3);
  gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::string_object,void>
            ((gc_heap_ptr<mjs::object> *)this,(gc_heap_ptr<mjs::string_object> *)local_40);
  gc_heap_ptr<mjs::string_object>::~gc_heap_ptr((gc_heap_ptr<mjs::string_object> *)local_40);
  string::~string((string *)&local_60);
  gc_heap_ptr<mjs::object>::~gc_heap_ptr((gc_heap_ptr<mjs::object> *)(local_40 + 0x10));
  oVar2.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
  oVar2.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (object_ptr)oVar2.super_gc_heap_ptr_untyped;
}

Assistant:

object_ptr new_string(const gc_heap_ptr<global_object>& global, const string& val) {
    auto proto = global->string_prototype();
    return global->heap().make<string_object>(proto->class_name(), proto, val, global->language_version() >= version::es5);
}